

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

char * debug_varname(GCproto *pt,BCPos pc,BCReg slot)

{
  byte bVar1;
  GCRef *pGVar2;
  uint32_t uVar3;
  GCproto *pGVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  char *p;
  GCproto *local_38;
  
  if (pt == (GCproto *)0x0) {
LAB_00113d48:
    pcVar5 = (char *)0x0;
  }
  else {
    uVar7 = 0;
    local_38 = pt;
    do {
      pcVar5 = (char *)local_38;
      bVar1 = (byte)(((GCproto *)pcVar5)->nextgc).gcptr64;
      uVar6 = (uint)bVar1;
      pGVar4 = (GCproto *)pcVar5;
      if (bVar1 < 7) {
        if (bVar1 == 0) goto LAB_00113d48;
      }
      else {
        do {
          pGVar4 = (GCproto *)((long)&(pGVar4->nextgc).gcptr64 + 1);
        } while ((char)(pGVar4->nextgc).gcptr64 != '\0');
      }
      local_38 = (GCproto *)((long)&(pGVar4->nextgc).gcptr64 + 1);
      uVar3 = lj_buf_ruleb128((char **)&local_38);
      uVar7 = uVar7 + uVar3;
      if (pc < uVar7) goto LAB_00113d48;
      uVar3 = lj_buf_ruleb128((char **)&local_38);
    } while ((uVar3 + uVar7 <= pc) || (bVar8 = slot != 0, slot = slot - 1, bVar8));
    if (bVar1 < 7) {
      pcVar5 = "(for index)";
      while (uVar6 = uVar6 - 1, uVar6 != 0) {
        do {
          pGVar2 = &((GCproto *)pcVar5)->nextgc;
          pcVar5 = (char *)((long)&(((GCproto *)pcVar5)->nextgc).gcptr64 + 1);
        } while ((char)pGVar2->gcptr64 != '\0');
      }
    }
  }
  return (char *)(GCproto *)pcVar5;
}

Assistant:

static const char *debug_varname(const GCproto *pt, BCPos pc, BCReg slot)
{
  const char *p = (const char *)proto_varinfo(pt);
  if (p) {
    BCPos lastpc = 0;
    for (;;) {
      const char *name = p;
      uint32_t vn = *(const uint8_t *)p;
      BCPos startpc, endpc;
      if (vn < VARNAME__MAX) {
	if (vn == VARNAME_END) break;  /* End of varinfo. */
      } else {
	do { p++; } while (*(const uint8_t *)p);  /* Skip over variable name. */
      }
      p++;
      lastpc = startpc = lastpc + lj_buf_ruleb128(&p);
      if (startpc > pc) break;
      endpc = startpc + lj_buf_ruleb128(&p);
      if (pc < endpc && slot-- == 0) {
	if (vn < VARNAME__MAX) {
#define VARNAMESTR(name, str)	str "\0"
	  name = VARNAMEDEF(VARNAMESTR);
#undef VARNAMESTR
	  if (--vn) while (*name++ || --vn) ;
	}
	return name;
      }
    }
  }
  return NULL;
}